

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryGrow
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryGrow *curr)

{
  Type type;
  Name memory;
  Name name;
  Name memory_00;
  char cVar1;
  Address x;
  Memory *pMVar2;
  uint64_t uVar3;
  ulong uVar4;
  Literal *this_00;
  Address size;
  undefined1 local_168 [8];
  Flow ret;
  Literal local_108;
  Literal local_f0;
  Literal local_d8;
  Literal local_c0;
  undefined1 local_a8 [8];
  Flow flow;
  Literal fail;
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_a8,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->delta);
  if (flow.breakTo.super_IString.str._M_len != 0) {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_a8;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)flow.breakTo.super_IString.str._M_len;
    goto LAB_00d1dcce;
  }
  getMemoryInstanceInfo
            ((MemoryInstanceInfo *)&fail.type,this,(Name)(curr->memory).super_IString.str);
  memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
  memory.super_IString.str._M_len = (size_t)info.instance;
  x = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)fail.type.id,memory);
  name.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)info.instance;
  pMVar2 = Module::getMemory(*(Module **)(fail.type.id + 0x20),name);
  type.id = (pMVar2->addressType).id;
  Literal::makeFromInt64((Literal *)&flow.breakTo.super_IString.str._M_str,-1,type);
  Literal::makeFromInt64((Literal *)&ret.breakTo.super_IString.str._M_str,x.addr,type);
  Flow::Flow((Flow *)local_168,(Literal *)&ret.breakTo.super_IString.str._M_str);
  Literal::~Literal((Literal *)&ret.breakTo.super_IString.str._M_str);
  if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_start -
             flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
      -0x5555555555555555 + (long)local_a8 != 1) {
    __assert_fail("values.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                  ,0x52,"const Literal &wasm::Flow::getSingleValue()");
  }
  uVar3 = Literal::getUnsigned((Literal *)&flow);
  uVar4 = -(ulong)(type.id != 2) | 0xffffffff;
  if (uVar4 >> 0x10 < uVar3) {
    Literal::Literal(&local_108,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_108);
    this_00 = &local_108;
LAB_00d1dca8:
    Literal::~Literal(this_00);
  }
  else {
    if (uVar4 - uVar3 <= x.addr) {
      Literal::Literal(&local_f0,(Literal *)&flow.breakTo.super_IString.str._M_str);
      Flow::Flow(__return_storage_ptr__,&local_f0);
      this_00 = &local_f0;
      goto LAB_00d1dca8;
    }
    size.addr = uVar3 + x.addr;
    if ((pMVar2->max).addr < size.addr) {
      Literal::Literal(&local_d8,(Literal *)&flow.breakTo.super_IString.str._M_str);
      Flow::Flow(__return_storage_ptr__,&local_d8);
      this_00 = &local_d8;
      goto LAB_00d1dca8;
    }
    cVar1 = (**(code **)(**(long **)(fail.type.id + 0x200) + 0x30))
                      (*(long **)(fail.type.id + 0x200),info.instance,
                       info.name.super_IString.str._M_len,x.addr << 0x10,size.addr * 0x10000);
    if (cVar1 == '\0') {
      Literal::Literal(&local_c0,(Literal *)&flow.breakTo.super_IString.str._M_str);
      Flow::Flow(__return_storage_ptr__,&local_c0);
      this_00 = &local_c0;
      goto LAB_00d1dca8;
    }
    memory_00.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memory_00.super_IString.str._M_len = (size_t)info.instance;
    setMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)fail.type.id,memory_00,size);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_168;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&ret);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)ret.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ret.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ret.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ret.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ret.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ret.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)ret.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)ret.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ret.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&ret);
  Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
LAB_00d1dcce:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryGrow(MemoryGrow* curr) {
    NOTE_ENTER("MemoryGrow");
    Flow flow = self()->visit(curr->delta);
    if (flow.breaking()) {
      return flow;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto* memory = info.instance->wasm.getMemory(info.name);
    auto addressType = memory->addressType;
    auto fail = Literal::makeFromInt64(-1, memory->addressType);
    Flow ret = Literal::makeFromInt64(memorySize, addressType);
    uint64_t delta = flow.getSingleValue().getUnsigned();
    uint64_t maxAddr = addressType == Type::i32
                         ? std::numeric_limits<uint32_t>::max()
                         : std::numeric_limits<uint64_t>::max();
    if (delta > maxAddr / Memory::kPageSize) {
      // Impossible to grow this much.
      return fail;
    }
    if (memorySize >= maxAddr - delta) {
      // Overflow.
      return fail;
    }
    auto newSize = memorySize + delta;
    if (newSize > memory->max) {
      return fail;
    }
    if (!info.interface()->growMemory(info.name,
                                      memorySize * Memory::kPageSize,
                                      newSize * Memory::kPageSize)) {
      // We failed to grow the memory in practice, even though it was valid
      // to try to do so.
      return fail;
    }
    memorySize = newSize;
    info.instance->setMemorySize(info.name, memorySize);
    return ret;
  }